

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab_employees.cpp
# Opt level: O0

void __thiscall lab_employees::getGroups(lab_employees *this)

{
  ostream *this_00;
  int local_14;
  int i;
  lab_employees *this_local;
  
  this_00 = std::operator<<((ostream *)&std::cout,"\n\tNumber of Groups : ");
  std::ostream::operator<<(this_00,(this->super_Person).num_groups);
  std::operator<<((ostream *)&std::cout,"\n\t Groups : ");
  for (local_14 = 0; local_14 < (this->super_Person).num_groups; local_14 = local_14 + 1) {
    std::ostream::operator<<((ostream *)&std::cout,(this->super_Person).groups[local_14]);
    if (local_14 + 1 != (this->super_Person).num_groups) {
      std::operator<<((ostream *)&std::cout,", ");
    }
  }
  return;
}

Assistant:

void lab_employees::getGroups(){

    cout<<"\n\tNumber of Groups : "<<this->num_groups;
    cout<<"\n\t Groups : ";
    for(int i=0;i<this->num_groups;i++){
        cout<<this->groups[i];
        if(i+1 != this->num_groups){
            cout<<", ";
        }
    }


}